

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_region_init_io_s390x
               (uc_struct_conflict14 *uc,MemoryRegion_conflict *mr,MemoryRegionOps *ops,void *opaque
               ,uint64_t size)

{
  uint64_t uVar1;
  
  memset(mr,0,0xa0);
  mr->uc = (uc_struct_conflict12 *)uc;
  mr->destructor = memory_region_destructor_none;
  (mr->subregions).tqh_first = (MemoryRegion *)0x0;
  (mr->subregions).tqh_circ.tql_prev = (QTailQLink *)&mr->subregions;
  uVar1 = 0;
  if (size != 0xffffffffffffffff) {
    uVar1 = size;
  }
  *(uint64_t *)&mr->size = uVar1;
  *(ulong *)((long)&mr->size + 8) = (ulong)(size == 0xffffffffffffffff);
  if (ops == (MemoryRegionOps *)0x0) {
    ops = &unassigned_mem_ops_s390x;
  }
  mr->ops = ops;
  mr->opaque = opaque;
  mr->terminates = true;
  mr->enabled = true;
  return;
}

Assistant:

void memory_region_init_io(struct uc_struct *uc,
                           MemoryRegion *mr,
                           const MemoryRegionOps *ops,
                           void *opaque,
                           uint64_t size)
{
    memory_region_init(uc, mr, size);
    mr->ops = ops ? ops : &unassigned_mem_ops;
    mr->opaque = opaque;
    mr->terminates = true;
}